

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O1

t_object * xemmai::t_module::f_instantiate(wstring_view a_name)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  t_pvalue *a_stack;
  ulong uVar2;
  ulong *puVar3;
  wstring_view a_path;
  wstring_view a_path_00;
  size_t sVar4;
  wchar_t *pwVar5;
  int iVar6;
  uintptr_t t;
  const_iterator cVar7;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar8;
  t_object *ptVar9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__str_00;
  wchar_t *extraout_RDX;
  wchar_t *extraout_RDX_00;
  wchar_t *pwVar10;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar11;
  wchar_t *extraout_RDX_01;
  wchar_t *in_RSI;
  _Base_ptr in_RDI;
  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *__const_this;
  t_type_of<xemmai::t_object> *this;
  t_pvalue *a_fields;
  t_object *unaff_R14;
  long in_FS_OFFSET;
  bool bVar12;
  wstring_view a_path_01;
  wstring_view a_name_00;
  wstring_view a_path_02;
  wstring_view a_name_01;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  undefined1 auVar13 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> __str;
  t_object *p;
  wstring path;
  _Alloc_hider in_stack_ffffffffffffff28;
  t_object *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_c8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_b8;
  t_object *local_a8;
  t_pvalue local_a0;
  t_object *local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_80;
  pthread_mutex_t *local_60;
  t_object *local_58;
  t_type *local_50;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 local_48;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 local_40;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + -0x60);
  local_b8._M_len = (size_t)in_RDI;
  local_b8._M_str = in_RSI;
  local_60 = (pthread_mutex_t *)
             t_lock_with_safe_region<std::recursive_mutex>::f_lock
                       ((recursive_mutex *)(lVar1 + 0x410));
  __mutex = (pthread_mutex_t *)(lVar1 + 0x170);
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  cVar7 = std::
          _Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
          ::_M_lower_bound_tr<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                    ((_Rb_tree<std::__cxx11::wstring,std::pair<std::__cxx11::wstring_const,xemmai::t_slot>,std::_Select1st<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                      *)(lVar1 + 0x3e0),&local_b8);
  bVar12 = true;
  if (((cVar7._M_node != (_Base_ptr)(lVar1 + 1000)) &&
      ((_Base_ptr)local_b8._M_len == cVar7._M_node[1]._M_parent)) &&
     (((_Base_ptr)local_b8._M_len == (_Base_ptr)0x0 ||
      (iVar6 = wmemcmp(local_b8._M_str,*(wchar_t **)(cVar7._M_node + 1),local_b8._M_len), iVar6 == 0
      )))) {
    *(undefined1 *)(*(long *)(cVar7._M_node + 2) + 0x19) = 1;
    pthread_mutex_unlock(__mutex);
    unaff_R14 = *(t_object **)(cVar7._M_node + 2);
    bVar12 = false;
  }
  if (bVar12) {
    pthread_mutex_unlock(__mutex);
    local_50 = *(t_type **)(lVar1 + 0x4a0);
    local_58 = *(t_object **)(local_50->v_fields + 0x30);
    ptVar9 = *(t_object **)(*(long *)(in_FS_OFFSET + -0x78) + 0x2e0);
    a_stack = *(t_pvalue **)(in_FS_OFFSET + -0x30);
    *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack + 2;
    a_stack[1].super_t_pointer.v_p = (t_object *)0x0;
    uVar2 = *(ulong *)(local_58->v_data + (long)&local_50[-1].f_less);
    if (uVar2 < 5) {
      this = *(t_type_of<xemmai::t_object> **)(*(long *)(in_FS_OFFSET + -0x78) + 0x10 + uVar2 * 8);
    }
    else {
      this = *(t_type_of<xemmai::t_object> **)(uVar2 + 0x40);
    }
    local_a0.super_t_pointer.v_p = *(t_object **)(local_58->v_data + (long)&local_50[-1].f_less);
    local_a0.field_0 =
         *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
          ((long)&local_50->v_depth + (long)local_58);
    a_fields = a_stack;
    t_type_of<xemmai::t_object>::f_invoke(this,&local_a0,ptVar9,&f_instantiate::index,a_stack,0);
    local_a8 = (a_stack->super_t_pointer).v_p;
    local_40 = a_stack->field_0;
    *(t_pvalue **)(in_FS_OFFSET + -0x30) = a_stack;
    if ((local_a8 != (t_object *)0x3) &&
       ((((local_a8 < (t_object *)0x3 || (local_a8 == (t_object *)0x4)) ||
         (local_a8->v_type->v_depth == 0)) ||
        ((undefined8 *)local_a8->v_type->v_ids[1] != &v__type_id<long>)))) {
      f_throw_type_error<unsigned_long>(L"size");
    }
    aVar8.v_integer = 0;
    do {
      local_48 = local_40;
      if ((t_object *)0x4 < local_a8) {
        local_48 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)local_a8->v_data;
      }
      aVar11 = aVar8;
      if ((ulong)local_48 <= (ulong)aVar8) break;
      uVar2 = *(ulong *)(local_58->v_data + (long)&local_50[-1].f_less);
      if (uVar2 < 5) {
        a_message_00._M_str = (wchar_t *)aVar8.v_integer;
        a_message_00._M_len = (size_t)L"not supported.";
        f_throw((xemmai *)0xe,a_message_00);
      }
      puVar3 = *(ulong **)(in_FS_OFFSET + -0x30);
      *(ulong **)(in_FS_OFFSET + -0x30) = puVar3 + 6;
      puVar3[4] = 3;
      ((anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(puVar3 + 5))->v_integer =
           (intptr_t)aVar8;
      local_38 = aVar8;
      for (auVar13 = (**(code **)(*(long *)(uVar2 + 0x40) + 0xd0))(uVar2,puVar3);
          a_message._M_str = auVar13._8_8_, auVar13._0_8_ != -1;
          auVar13 = (**(code **)(*(long *)(uVar2 + 0x40) + 0xb8))(uVar2,puVar3,auVar13._0_8_)) {
        uVar2 = *puVar3;
        if (uVar2 < 5) {
          a_message._M_len = (size_t)L"not supported.";
          f_throw((xemmai *)0xe,a_message);
        }
      }
      uVar2 = *puVar3;
      *(ulong **)(in_FS_OFFSET + -0x30) = puVar3;
      if (((uVar2 < 5) || (*(long *)(*(long *)(uVar2 + 0x40) + 8) == 0)) ||
         (*(undefined8 **)(*(long *)(*(long *)(uVar2 + 0x40) + 0x10) + 8) !=
          &v__type_id<xemmai::t_string>)) {
        f_throw_type_error<xemmai::t_string>(L"path");
      }
      a_path_01._M_str = (wchar_t *)(uVar2 + 0x50);
      a_path_01._M_len = *(size_t *)(uVar2 + 0x48);
      portable::t_path::t_path((t_path *)&local_80,a_path_01);
      a_path_00._M_str = local_b8._M_str;
      a_path_00._M_len = local_b8._M_len;
      portable::t_path::operator/((t_path *)&stack0xffffffffffffff28,(t_path *)&local_80,a_path_00);
      local_a0.super_t_pointer.v_p = (t_object *)&local_90;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_a0,in_stack_ffffffffffffff28._M_p,
                 in_stack_ffffffffffffff28._M_p + (long)local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)in_stack_ffffffffffffff28._M_p != &local_c8) {
        operator_delete(in_stack_ffffffffffffff28._M_p,local_c8._M_allocated_capacity * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity * 4 + 4);
      }
      in_stack_ffffffffffffff28._M_p = (pointer)&local_c8;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&stack0xffffffffffffff28,local_a0.super_t_pointer.v_p,
                 (local_a0.super_t_pointer.v_p)->v_data + local_a0.field_0.v_integer * 4 + -0x48);
      std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
      append((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &stack0xffffffffffffff28,L".xm");
      a_path._M_str = in_stack_ffffffffffffff28._M_p;
      a_path._M_len = 0x1313dc;
      ptVar9 = f_load_script(a_path);
      pwVar10 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)in_stack_ffffffffffffff28._M_p != &local_c8) {
        operator_delete(in_stack_ffffffffffffff28._M_p,local_c8._M_allocated_capacity * 4 + 4);
        pwVar10 = extraout_RDX_00;
      }
      pwVar5 = local_b8._M_str;
      sVar4 = local_b8._M_len;
      if (ptVar9 == (t_object *)0x0) {
        a_path_02._M_str = pwVar10;
        a_path_02._M_len = (size_t)local_a0.super_t_pointer.v_p;
        ptVar9 = f_load_library((t_module *)local_a0.field_0,a_path_02);
        pwVar10 = local_b8._M_str;
        sVar4 = local_b8._M_len;
        bVar12 = ptVar9 == (t_object *)0x0;
        if (!bVar12) {
          (**(code **)(*(long *)ptVar9->v_data + 0x18))(&stack0xffffffffffffff28,ptVar9->v_data);
          a_name_01._M_str = (wchar_t *)ptVar9;
          a_name_01._M_len = (size_t)pwVar10;
          unaff_R14 = f_new((t_module *)sVar4,a_name_01,(t_object *)&stack0xffffffffffffff28,
                            (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                             *)a_fields);
          std::
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                     *)&stack0xffffffffffffff28);
          goto LAB_00131496;
        }
      }
      else {
        pwVar10 = *(wchar_t **)ptVar9->v_data;
        f_execute_script((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                          *)&stack0xffffffffffffff28,ptVar9);
        a_name_00._M_str = pwVar10;
        a_name_00._M_len = (size_t)pwVar5;
        unaff_R14 = f_new((t_module *)sVar4,a_name_00,(t_object *)&stack0xffffffffffffff28,
                          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                           *)a_fields);
        std::
        vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
        ::~vector((vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
                   *)&stack0xffffffffffffff28);
LAB_00131496:
        bVar12 = false;
      }
      if (local_a0.super_t_pointer.v_p != (t_object *)&local_90) {
        operator_delete(local_a0.super_t_pointer.v_p,(long)local_90 * 4 + 4);
      }
      aVar8.v_integer = local_38.v_integer + 1;
      aVar11 = local_38;
    } while (bVar12);
    if ((ulong)local_48 <= (ulong)aVar11) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)&local_80,local_b8._M_str,local_b8._M_str + local_b8._M_len);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &stack0xffffffffffffff28,L"module \"",&local_80);
      __str_00 = std::__cxx11::
                 basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::append
                           ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)&stack0xffffffffffffff28,L"\" not found.");
      std::__cxx11::wstring::wstring((wstring *)&local_a0,__str_00);
      a_message_01._M_str = extraout_RDX_01;
      a_message_01._M_len = (size_t)local_a0.super_t_pointer.v_p;
      f_throw((xemmai *)local_a0.field_0,a_message_01);
    }
  }
  pthread_mutex_unlock(local_60);
  return unaff_R14;
}

Assistant:

t_object* t_module::f_instantiate(std::wstring_view a_name)
{
	auto engine = f_engine();
	t_lock_with_safe_region lock(engine->v_module__instantiate__mutex);
	engine->v_object__reviving__mutex.lock();
	{
		auto& instances = engine->v_module__instances;
		auto i = instances.lower_bound(a_name);
		if (i != instances.end() && i->first == a_name) {
			i->second->v_reviving = true;
			engine->v_object__reviving__mutex.unlock();
			return i->second;
		}
	}
	engine->v_object__reviving__mutex.unlock();
	auto& paths = engine->f_module_system()->f_fields()[/*path*/0];
	static size_t index;
	auto n = paths.f_invoke(f_global()->f_symbol_size(), index);
	f_check<size_t>(n, L"size");
	for (size_t i = 0; i < f_as<size_t>(n); ++i) {
		auto x = paths.f_get_at(i);
		f_check<t_string>(x, L"path");
		std::wstring path = portable::t_path(x->f_as<t_string>()) / a_name;
		if (auto code = f_load_script(path + L".xm")) return f_new(a_name, code->f_as<t_code>().v_module, f_execute_script(code));
		if (auto body = f_load_library(path)) return f_new(a_name, body, body->f_as<t_library>().f_define());
	}
	f_throw(L"module \"" + std::wstring(a_name) + L"\" not found.");
}